

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_cpputest_realloc_larger_Test::TEST_TestHarness_c_cpputest_realloc_larger_Test
          (TEST_TestHarness_c_cpputest_realloc_larger_Test *this)

{
  TEST_TestHarness_c_cpputest_realloc_larger_Test *this_local;
  
  memset(this,0,0x10);
  TEST_GROUP_CppUTestGroupTestHarness_c::TEST_GROUP_CppUTestGroupTestHarness_c
            (&this->super_TEST_GROUP_CppUTestGroupTestHarness_c);
  (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_TestHarness_c_cpputest_realloc_larger_Test_00407428;
  return;
}

Assistant:

TEST(TestHarness_c, cpputest_realloc_larger)
{
    const char* number_string = "123456789";

    char* mem1 = (char*) cpputest_malloc(10);

    SimpleString::StrNCpy(mem1, number_string, 10);

    CHECK(mem1 != NULLPTR);

    char* mem2 = (char*) cpputest_realloc(mem1, 1000);

    CHECK(mem2 != NULLPTR);
    STRCMP_EQUAL(number_string, mem2);

    cpputest_free(mem2);
}